

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::BSTinsert
          (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,node *curr,
          value_type *val)

{
  value_type vVar1;
  value_type vVar2;
  int *in_RCX;
  undefined8 extraout_RDX;
  undefined1 uVar3;
  value_type vVar4;
  value_type *pvVar5;
  pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> pVar6;
  
  vVar2.first = curr->colour;
  vVar2.second = *(second_type *)&curr->field_0xc;
  curr->right->parent->left = (treeNode<ft::pair<const_int,_int>_> *)vVar2;
  curr->parent->parent->right = (treeNode<ft::pair<const_int,_int>_> *)vVar2;
  vVar4 = vVar2;
  if (vVar2 != (value_type)val) {
    do {
      vVar4 = (value_type)val;
      if (*(int *)vVar4 == *in_RCX) {
        uVar3 = 0;
        goto LAB_0010b61d;
      }
      val = (value_type *)((value_type *)((long)vVar4 + 0x10))[*(int *)vVar4 <= *in_RCX];
    } while (((value_type *)((long)vVar4 + 0x10))[*(int *)vVar4 <= *in_RCX] != vVar2);
  }
  vVar2 = (value_type)operator_new(0x28);
  *(undefined8 *)vVar2 = *(undefined8 *)in_RCX;
  *(int *)((long)vVar2 + 8) = 0;
  ((int *)((long)vVar2 + 0x10))[0] = 0;
  ((int *)((long)vVar2 + 0x10))[1] = 0;
  ((int *)((long)vVar2 + 0x18))[0] = 0;
  ((int *)((long)vVar2 + 0x18))[1] = 0;
  *(value_type *)((long)vVar2 + 0x20) = vVar4;
  vVar1.first = curr->colour;
  vVar1.second = *(second_type *)&curr->field_0xc;
  if (vVar4 == vVar1) {
    pvVar5 = (value_type *)&curr->left;
  }
  else if (*(int *)vVar2 < *(int *)vVar4) {
    pvVar5 = (value_type *)((long)vVar4 + 0x10);
  }
  else {
    pvVar5 = (value_type *)((long)vVar4 + 0x18);
  }
  *pvVar5 = vVar2;
  *(value_type *)((long)vVar2 + 0x10) = vVar1;
  *(value_type *)((long)vVar2 + 0x18) = vVar1;
  uVar3 = 1;
  vVar4 = vVar2;
LAB_0010b61d:
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ::attach((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            *)curr);
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ._vptr_treeBase = (_func_int **)vVar4;
  *(undefined1 *)
   &(this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
    super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
    .m_tree.NIL = uVar3;
  pVar6._8_8_ = extraout_RDX;
  pVar6.first = (first_type)this;
  return pVar6;
}

Assistant:

ft::pair<node*, bool>	BSTinsert(node* curr, value_type const & val) {
		this->detach();

		node*	p = this->NIL();

		while (curr != this->NIL()) {
			p = curr;
			if (this->equal(val, curr->value)) {
				this->attach();
				return ft::make_pair(curr, false);
			}
			else if (this->value_comp()(val, curr->value))
				curr = curr->left;
			else
				curr = curr->right;
		}

		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);

		newNode->parent = p;

		if (p == this->NIL())
			this->m_tree.m_root = newNode;
		else if (this->value_comp()(newNode->value, p->value))
			p->left = newNode;
		else
			p->right = newNode;

		newNode->left = this->NIL();
		newNode->right = this->NIL();

		this->attach();

		return ft::make_pair(newNode, true);
	}